

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportFileGenerator::PopulateCxxModuleExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          PreprocessContext ctx,string *includesDestinationDirs,string *errorMessage)

{
  int iVar1;
  cmTarget *pcVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  cmMakefile *pcVar6;
  cmValue cVar7;
  mapped_type *pmVar8;
  long lVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string propNameStr_1;
  string value;
  string exportedPropName;
  ModulePropertyTable exportedModuleProperties [4];
  string local_118;
  string local_f8;
  char *local_d8;
  undefined8 local_d0;
  string local_c8;
  cmExportFileGenerator *local_a8;
  string *local_a0;
  string local_98;
  char *local_78;
  undefined4 local_70;
  undefined8 local_68;
  char *local_60;
  undefined4 local_58;
  undefined8 local_50;
  char *local_48;
  undefined4 local_40;
  
  local_a8 = this;
  local_a0 = includesDestinationDirs;
  bVar5 = cmGeneratorTarget::HaveCxx20ModuleSources(gte,errorMessage);
  if (bVar5) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CXX_EXTENSIONS","");
    pcVar2 = gte->Target;
    pcVar6 = cmTarget::GetMakefile(pcVar2);
    cVar7 = cmTarget::GetComputedProperty(pcVar2,&local_98,pcVar6);
    if ((cVar7.Value != (string *)0x0) ||
       (cVar7 = cmTarget::GetProperty(gte->Target,&local_98), cVar7.Value != (string *)0x0)) {
      cmGeneratorExpression::Preprocess(&local_f8,cVar7.Value,ctx,false);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,&local_98);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                               local_98.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_98._M_dataplus._M_p = (pointer)0x13;
    local_98._M_string_length = 0x916746;
    local_98.field_2._M_allocated_capacity._0_4_ = 2;
    local_98.field_2._8_8_ = 0x13;
    local_78 = "COMPILE_DEFINITIONS";
    local_70 = 0;
    local_68 = 0xf;
    local_60 = "COMPILE_OPTIONS";
    local_58 = 0;
    local_50 = 0x10;
    local_48 = "COMPILE_FEATURES";
    local_40 = 0;
    lVar9 = 0x10;
    do {
      lVar3 = *(long *)((long)&local_a8 + lVar9);
      pcVar4 = *(char **)((long)&local_a0 + lVar9);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar4,pcVar4 + lVar3);
      pcVar2 = gte->Target;
      pcVar6 = cmTarget::GetMakefile(pcVar2);
      cVar7 = cmTarget::GetComputedProperty(pcVar2,&local_118,pcVar6);
      if ((cVar7.Value != (string *)0x0) ||
         (cVar7 = cmTarget::GetProperty(gte->Target,&local_118), cVar7.Value != (string *)0x0)) {
        local_f8._M_dataplus._M_p = (pointer)0x15;
        local_f8._M_string_length = 0x951b2e;
        local_f8.field_2._M_allocated_capacity = 0;
        local_d0 = 0;
        views._M_len = 2;
        views._M_array = (iterator)&local_f8;
        local_f8.field_2._8_8_ = lVar3;
        local_d8 = pcVar4;
        cmCatViews(&local_c8,views);
        cmGeneratorExpression::Preprocess(&local_f8,cVar7.Value,ctx,false);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&local_c8);
        std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((ctx == InstallInterface) &&
           (iVar1 = *(int *)((long)&local_98._M_dataplus._M_p + lVar9), iVar1 - 1U < 2)) {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&local_c8);
          (*local_a8->_vptr_cmExportFileGenerator[0x14])(local_a8,pmVar8);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,&local_c8);
          prefixItems(pmVar8);
          if ((iVar1 == 2) && (local_a0->_M_string_length != 0)) {
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,&local_c8);
            if (pmVar8->_M_string_length != 0) {
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](properties,&local_c8);
              std::__cxx11::string::push_back((char)pmVar8);
            }
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,&local_c8);
            std::__cxx11::string::_M_append((char *)pmVar8,(ulong)(local_a0->_M_dataplus)._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x70);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"LINK_LIBRARIES","");
    pcVar2 = gte->Target;
    pcVar6 = cmTarget::GetMakefile(pcVar2);
    cVar7 = cmTarget::GetComputedProperty(pcVar2,&local_118,pcVar6);
    if ((cVar7.Value != (string *)0x0) ||
       (cVar7 = cmTarget::GetProperty(gte->Target,&local_118), cVar7.Value != (string *)0x0)) {
      local_f8._M_dataplus._M_p = (pointer)0x15;
      local_f8._M_string_length = 0x951b2e;
      local_f8.field_2._M_allocated_capacity = 0;
      local_f8.field_2._8_8_ = 0xe;
      local_d8 = "LINK_LIBRARIES";
      local_d0 = 0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_f8;
      cmCatViews(&local_c8,views_00);
      cmGeneratorExpression::Preprocess(&local_f8,cVar7.Value,ctx,false);
      ResolveTargetsInGeneratorExpressions(local_a8,&local_f8,gte,ReplaceFreeTargets);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,&local_c8);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  return true;
}

Assistant:

bool cmExportFileGenerator::PopulateCxxModuleExportProperties(
  cmGeneratorTarget const* gte, ImportPropertyMap& properties,
  cmGeneratorExpression::PreprocessContext ctx,
  std::string const& includesDestinationDirs, std::string& errorMessage)
{
  if (!gte->HaveCxx20ModuleSources(&errorMessage)) {
    return true;
  }

  const cm::static_string_view exportedDirectModuleProperties[] = {
    "CXX_EXTENSIONS"_s,
  };
  for (auto const& propName : exportedDirectModuleProperties) {
    auto const propNameStr = std::string(propName);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      properties[propNameStr] = cmGeneratorExpression::Preprocess(*prop, ctx);
    }
  }

  const ModulePropertyTable exportedModuleProperties[] = {
    { "INCLUDE_DIRECTORIES"_s, PropertyType::IncludePaths },
    { "COMPILE_DEFINITIONS"_s, PropertyType::Strings },
    { "COMPILE_OPTIONS"_s, PropertyType::Strings },
    { "COMPILE_FEATURES"_s, PropertyType::Strings },
  };
  for (auto const& propEntry : exportedModuleProperties) {
    auto const propNameStr = std::string(propEntry.Name);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      auto const exportedPropName =
        cmStrCat("IMPORTED_CXX_MODULES_", propEntry.Name);
      properties[exportedPropName] =
        cmGeneratorExpression::Preprocess(*prop, ctx);
      if (ctx == cmGeneratorExpression::InstallInterface &&
          PropertyTypeIsForPaths(propEntry.Type)) {
        this->ReplaceInstallPrefix(properties[exportedPropName]);
        prefixItems(properties[exportedPropName]);
        if (propEntry.Type == PropertyType::IncludePaths &&
            !includesDestinationDirs.empty()) {
          if (!properties[exportedPropName].empty()) {
            properties[exportedPropName] += ';';
          }
          properties[exportedPropName] += includesDestinationDirs;
        }
      }
    }
  }

  const cm::static_string_view exportedLinkModuleProperties[] = {
    "LINK_LIBRARIES"_s,
  };
  for (auto const& propName : exportedLinkModuleProperties) {
    auto const propNameStr = std::string(propName);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      auto const exportedPropName =
        cmStrCat("IMPORTED_CXX_MODULES_", propName);
      auto value = cmGeneratorExpression::Preprocess(*prop, ctx);
      this->ResolveTargetsInGeneratorExpressions(
        value, gte, cmExportFileGenerator::ReplaceFreeTargets);
      properties[exportedPropName] = value;
    }
  }

  return true;
}